

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

ON__UINT64 __thiscall
ON_SerialNumberMap::GetElements
          (ON_SerialNumberMap *this,ON__UINT64 sn0,ON__UINT64 sn1,ON__UINT64 max_count,
          ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT> *elements)

{
  ON_SN_BLOCK **ppOVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ON__UINT64 OVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ON__UINT64 OVar9;
  ON_SN_BLOCK *pOVar10;
  ulong uVar11;
  long lVar12;
  ON__UINT64 *pOVar13;
  SN_ELEMENT *pSVar14;
  SN_ELEMENT *x;
  SN_ELEMENT *pSVar15;
  ulong local_70;
  
  if (max_count == 0 || sn1 < sn0) {
    return 0;
  }
  uVar6 = this->m_sn_count;
  uVar4 = this->m_sn_purged;
  if (uVar6 <= uVar4) {
    return 0;
  }
  lVar12 = (long)*(int *)(elements + 0x10);
  if (sn0 + 3 <= sn1) {
    ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Reserve(elements,lVar12 + 3);
    for (; sn0 <= sn1; sn0 = sn0 + 1) {
      pSVar15 = FindElementHelper(this,sn0);
      if ((pSVar15 != (SN_ELEMENT *)0x0) && (pSVar15->m_sn_active != '\0')) {
        ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,pSVar15);
      }
    }
    return *(int *)(elements + 0x10) - lVar12;
  }
  uVar3 = this->m_snblk_list_count;
  ppOVar1 = this->m_snblk_list;
  for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
    pOVar10 = ppOVar1[uVar8];
    if (sn0 <= pOVar10->m_sn1) {
      if (sn1 < pOVar10->m_sn0) goto LAB_004ea218;
      pSVar15 = (SN_ELEMENT *)0x0;
      uVar11 = uVar8;
      goto LAB_004ea223;
    }
  }
  uVar7 = 0;
  uVar8 = uVar3;
LAB_004ea28d:
  pSVar15 = (SN_ELEMENT *)0x0;
  OVar9 = 0;
LAB_004ea28f:
  pOVar10 = this->m_sn_block0;
  uVar3 = (ulong)pOVar10->m_purged;
  if ((((pOVar10->m_count <= pOVar10->m_purged) || (sn1 < pOVar10->m_sn0)) || (pOVar10->m_sn1 < sn0)
      ) || (pOVar10->m_sorted != 0)) {
    pSVar14 = (SN_ELEMENT *)0x0;
    local_70 = 0;
    goto LAB_004ea2ca;
  }
  if (uVar3 == 0) {
LAB_004ea4b6:
    if (this->m_bHashTableIsValid != '\0') {
      this->m_bHashTableIsValid = '\0';
    }
    ON_SN_BLOCK::SortBlockHelper(pOVar10);
    pOVar10 = this->m_sn_block0;
    if ((pOVar10->m_sn0 <= sn1) && (sn0 <= pOVar10->m_sn1)) {
      local_70 = (ulong)pOVar10->m_count;
      pSVar14 = pOVar10->m_sn;
      OVar5 = ON_SN_BLOCK::ActiveElementEstimate(pOVar10,pOVar10->m_sn[0].m_sn,sn1);
      OVar9 = OVar9 + OVar5;
      goto LAB_004ea2ca;
    }
  }
  else {
    if (this->m_bHashTableIsValid != '\0') {
      this->m_bHashTableIsValid = '\0';
    }
    this->m_sn_count = uVar6 - uVar3;
    this->m_sn_purged = uVar4 - uVar3;
    ON_SN_BLOCK::CullBlockHelper(pOVar10);
    UpdateMaxSNHelper(this);
    pOVar10 = this->m_sn_block0;
    if (pOVar10->m_count != 0) goto LAB_004ea4b6;
  }
  pSVar14 = (SN_ELEMENT *)0x0;
  local_70 = 0;
LAB_004ea2ca:
  uVar6 = (sn1 - sn0) + 1;
  if (OVar9 < uVar6) {
    uVar6 = OVar9;
  }
  if (0x1fff < uVar6) {
    uVar6 = 0x2000;
  }
  ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Reserve
            (elements,(long)*(int *)(elements + 0x10) + uVar6);
  while (uVar4 = uVar8, x = pSVar14, uVar6 = local_70,
        x != (SN_ELEMENT *)0x0 || pSVar15 != (SN_ELEMENT *)0x0) {
    uVar8 = uVar4;
    if ((x == (SN_ELEMENT *)0x0) || ((pSVar15 != (SN_ELEMENT *)0x0 && (pSVar15->m_sn <= x->m_sn))))
    {
      if (pSVar15->m_sn_active != '\0') {
        ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,pSVar15);
      }
      pSVar14 = x;
      if (uVar7 == 1) {
        uVar8 = uVar4 + 1;
        uVar7 = 0;
        pSVar15 = (SN_ELEMENT *)0x0;
        if (uVar8 < this->m_snblk_list_count) {
          pOVar10 = this->m_snblk_list[uVar4 + 1];
          uVar7 = 0;
          pSVar15 = (SN_ELEMENT *)0x0;
          if (sn1 <= pOVar10->m_sn0) {
            uVar7 = (ulong)pOVar10->m_count;
            pSVar15 = pOVar10->m_sn;
          }
        }
      }
      else {
        if (sn1 < pSVar15[1].m_sn) {
          pSVar15 = (SN_ELEMENT *)0x0;
        }
        else {
          pSVar15 = pSVar15 + 1;
        }
        uVar7 = uVar7 - 1;
      }
    }
    else {
      if (x->m_sn_active != '\0') {
        ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,x);
      }
      local_70 = 0;
      uVar6 = uVar6 - 1;
      pSVar14 = (SN_ELEMENT *)0x0;
      if (uVar6 != 0) {
        pSVar14 = (SN_ELEMENT *)0x0;
        local_70 = uVar6;
        if (x[1].m_sn <= sn1) {
          pSVar14 = x + 1;
        }
      }
    }
  }
  return *(int *)(elements + 0x10) - lVar12;
  while( true ) {
    pOVar10 = ppOVar1[uVar8];
    uVar7 = 0;
    OVar9 = 0;
    if (sn1 < pOVar10->m_sn0) break;
LAB_004ea223:
    uVar11 = uVar11 + 1;
    uVar7 = (ulong)pOVar10->m_count;
    pOVar13 = &pOVar10->m_sn[1].m_sn;
LAB_004ea22b:
    uVar2 = pOVar13[-7];
    if ((sn0 <= uVar2) && ((char)pOVar13[-6] != '\0')) {
      if (uVar2 <= sn1) {
        pSVar15 = (SN_ELEMENT *)(pOVar13 + -9);
        OVar5 = ON_SN_BLOCK::ActiveElementEstimate(ppOVar1[uVar8],uVar2,sn1);
        OVar9 = OVar5;
        while ((uVar11 < uVar3 && (ppOVar1[uVar11]->m_sn0 <= sn1))) {
          OVar9 = OVar9 + OVar5;
          uVar11 = uVar11 + 1;
        }
        break;
      }
      goto LAB_004ea28d;
    }
    if (uVar7 != 1) goto code_r0x004ea243;
    uVar8 = uVar8 + 1;
    if (uVar3 <= uVar8) goto LAB_004ea218;
  }
  goto LAB_004ea28f;
code_r0x004ea243:
  uVar7 = uVar7 - 1;
  uVar2 = *pOVar13;
  pOVar13 = pOVar13 + 7;
  if (sn1 < uVar2) goto LAB_004ea28d;
  goto LAB_004ea22b;
LAB_004ea218:
  uVar7 = 0;
  goto LAB_004ea28d;
}

Assistant:

ON__UINT64 ON_SerialNumberMap::GetElements(
  ON__UINT64 sn0,
  ON__UINT64 sn1, 
  ON__UINT64 max_count,
  ON_SimpleArray<SN_ELEMENT>& elements
  ) const
{
  ON__UINT64 i,j,k,c;
  const SN_ELEMENT *ei, *ek;

  const int elements_count0 = elements.Count();

  if ( sn1 < sn0 || max_count <= 0 || m_sn_count <= m_sn_purged )
    return 0;

  if ( sn0+3 <= sn1 )
  {
    elements.Reserve(elements_count0+3);
    while ( sn0 <= sn1 )
    {
      ei = const_cast<ON_SerialNumberMap*>(this)->FindElementHelper(sn0++);
      if ( ei && ei->m_sn_active )
        elements.Append(*ei);
    }
    return (elements.Count() - elements_count0); 
  }

  ek = 0;
  k = 0;
  for ( j = 0; j < m_snblk_list_count; j++ )
  {
    if ( m_snblk_list[j]->m_sn1 < sn0 )
      continue;
    if ( sn1 < m_snblk_list[j]->m_sn0 )
      break;

    k = m_snblk_list[j]->m_count; // always > 0
    ek = &m_snblk_list[j]->m_sn[0];
    while ( ek->m_sn < sn0 || !ek->m_sn_active )
    {
      if ( --k )
      {
        if ((++ek)->m_sn > sn1)
        {
          ek = 0;
          break;
        }
      }
      else if ( ++j < m_snblk_list_count && m_snblk_list[j]->m_sn0 <= sn1 )
      {
        k = m_snblk_list[j]->m_count; // always > 0
        ek = &m_snblk_list[j]->m_sn[0];
      }
      else
      {
        ek = 0;
        break;
      }
    }
    if ( ek && ek->m_sn > sn1 )
      ek = 0;
    break;
  }

  // set c = estimate of number of items in m_snblk_list[]
  if ( ek )
  {
    c = m_snblk_list[j]->ActiveElementEstimate(ek->m_sn,sn1);
    for ( i = j+1; i < m_snblk_list_count && m_snblk_list[i]->m_sn0 <= sn1; i++ )
    {
      c += m_snblk_list[j]->ActiveElementEstimate(ek->m_sn,sn1);
    }
  }
  else
    c = 0;

  // determine where to begin searching in m_sn_block0
  i = 0;
  ei = 0;
  if (    m_sn_block0.m_count > m_sn_block0.m_purged
       && sn1 >= m_sn_block0.m_sn0
       && sn0 <= m_sn_block0.m_sn1
       && !m_sn_block0.m_sorted
     )
  {
    if ( !m_sn_block0.m_sorted )
    {
      if ( m_sn_block0.m_purged > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();
        const_cast<ON_SerialNumberMap*>(this)->m_sn_count -= m_sn_block0.m_purged;
        const_cast<ON_SerialNumberMap*>(this)->m_sn_purged -= m_sn_block0.m_purged;
        const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.CullBlockHelper();
        const_cast<ON_SerialNumberMap*>(this)->UpdateMaxSNHelper();
      }
      if ( m_sn_block0.m_count > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();
        const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.SortBlockHelper();
        if ( sn1 >= m_sn_block0.m_sn0 && sn0 <= m_sn_block0.m_sn1 )
        {
          i = m_sn_block0.m_count;
          ei = &m_sn_block0.m_sn[0];
        }
      }
    }
    else
    {
      i = m_sn_block0.m_count;
      ei = &m_sn_block0.m_sn[0];
      while ( ei->m_sn < sn0 || !ei->m_sn_active )
      {
        if ( --i )
          ei++;
        else
        {
          ei = 0;
          break;
        }
      }
      if ( ei && ei->m_sn > sn1 )
      {
        ei = 0;
      }
    }
  }

  // adjust c = estimate of number of items in m_snblk_list[]
  if ( ei )
    c += m_sn_block0.ActiveElementEstimate(ei->m_sn,sn1);
  if (c > (sn1-sn0+1) )
    c = (sn1-sn0+1);
  if ( c > 2*4096 )
    c = 2*4096;

  // reserve room for elements so we don't thrash memory
  // while growing a large dynamic array.
  elements.Reserve(elements.Count()+((int)c));

  // Add appropriate elements to elements[] array.
  while (ei || ek)
  {
    if (ei && (!ek || ei->m_sn < ek->m_sn) )
    {
      if ( ei->m_sn_active )
        elements.Append(*ei);
      if ( --i )
      {
        if ( (++ei)->m_sn > sn1 )
        {
          ei = 0;
        }
      }
      else
      {
        ei = 0;
      }
    }
    else 
    {
      if ( ek->m_sn_active )
        elements.Append(*ek);
      if ( --k )
      {
        if ( (++ek)->m_sn > sn1 )
        {
          ek = 0;
        }
      }
      else if (++j < m_snblk_list_count && sn1 <= m_snblk_list[j]->m_sn0 )
      {
        k = m_snblk_list[j]->m_count; // always > 0
        ek = &m_snblk_list[j]->m_sn[0];
      }
      else 
      {
        ek = 0;
      }
    }
  }
  
  return (elements.Count() - elements_count0);
}